

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean socketNotifierSourceCheck(GSource *source)

{
  Type TVar1;
  qsizetype qVar2;
  const_reference ppGVar3;
  long in_RDI;
  long in_FS_OFFSET;
  GPollFDWithQSocketNotifier *p;
  int i;
  bool pending;
  GSocketNotifierSource *src;
  char *t [3];
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined3 uVar4;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 enable;
  GPollFDWithQSocketNotifier *this;
  int local_60;
  byte local_59;
  QMessageLogger local_48;
  char *local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = 0;
  local_60 = 0;
  while( true ) {
    enable = false;
    if (local_59 == 0) {
      in_stack_ffffffffffffff88 = (char *)(long)local_60;
      qVar2 = QList<GPollFDWithQSocketNotifier_*>::size
                        ((QList<GPollFDWithQSocketNotifier_*> *)(in_RDI + 0x60));
      enable = (long)in_stack_ffffffffffffff88 < qVar2;
    }
    if ((bool)enable == false) break;
    ppGVar3 = QList<GPollFDWithQSocketNotifier_*>::at
                        ((QList<GPollFDWithQSocketNotifier_*> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    this = *ppGVar3;
    if (((this->pollfd).revents & 0x20) == 0) {
      uVar4 = (undefined3)in_stack_ffffffffffffff80;
      in_stack_ffffffffffffff80 = CONCAT13(1,uVar4);
      if (local_59 == 0) {
        in_stack_ffffffffffffff80 =
             CONCAT13(((this->pollfd).revents & (this->pollfd).events) != 0,uVar4);
      }
      local_59 = (byte)((uint)in_stack_ffffffffffffff80 >> 0x18);
    }
    else {
      local_28[0] = "Read";
      local_28[1] = "Write";
      local_28[2] = "Exception";
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(enable,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffff84 = (this->pollfd).fd;
      TVar1 = QSocketNotifier::type
                        ((QSocketNotifier *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QMessageLogger::warning
                (&local_48,"QSocketNotifier: Invalid socket %d and type \'%s\', disabling...",
                 (ulong)in_stack_ffffffffffffff84,local_28[(int)TVar1]);
      QSocketNotifier::setEnabled((QSocketNotifier *)this,(bool)enable);
      local_60 = local_60 + -1;
    }
    local_60 = local_60 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)local_59;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean socketNotifierSourceCheck(GSource *source)
{
    GSocketNotifierSource *src = reinterpret_cast<GSocketNotifierSource *>(source);

    bool pending = false;
    for (int i = 0; !pending && i < src->pollfds.size(); ++i) {
        GPollFDWithQSocketNotifier *p = src->pollfds.at(i);

        if (p->pollfd.revents & G_IO_NVAL) {
            // disable the invalid socket notifier
            const char * const t[] = { "Read", "Write", "Exception" };
            qWarning("QSocketNotifier: Invalid socket %d and type '%s', disabling...",
                     p->pollfd.fd, t[int(p->socketNotifier->type())]);
            // ### note, modifies src->pollfds!
            p->socketNotifier->setEnabled(false);
            i--;
        } else {
            pending = pending || ((p->pollfd.revents & p->pollfd.events) != 0);
        }
    }

    return pending;
}